

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall OPL::DOSBox::DBOPL::Chip::WriteBD(Chip *this,Bit8u val)

{
  Bit8u *pBVar1;
  byte bVar2;
  code *pcVar3;
  
  if (this->regBD != val) {
    bVar2 = this->regBD ^ val;
    this->regBD = val;
    this->vibratoStrength = (val & 0x40) == 0;
    this->tremoloStrength = (byte)~val >> 6 & 2;
    if ((val & 0x20) == 0) {
      if ((bVar2 & 0x20) == 0) {
        return;
      }
      bVar2 = this->chan[6].regC0;
      this->chan[6].regC0 = ~bVar2;
      Channel::WriteC0(this->chan + 6,this,bVar2);
      pBVar1 = &this->chan[6].op[0].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      if ((*pBVar1 == '\0') && (this->chan[6].op[0].state != '\0')) {
        this->chan[6].op[0].state = '\x01';
        this->chan[6].op[0].volHandler =
             (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
        *(undefined8 *)&this->chan[6].op[0].field_0x8 = 0;
      }
      pBVar1 = &this->chan[6].op[1].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      if ((*pBVar1 == '\0') && (this->chan[6].op[1].state != '\0')) {
        this->chan[6].op[1].state = '\x01';
        this->chan[6].op[1].volHandler =
             (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
        *(undefined8 *)&this->chan[6].op[1].field_0x8 = 0;
      }
      pBVar1 = &this->chan[7].op[0].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      if ((*pBVar1 == '\0') && (this->chan[7].op[0].state != '\0')) {
        this->chan[7].op[0].state = '\x01';
        this->chan[7].op[0].volHandler =
             (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
        *(undefined8 *)&this->chan[7].op[0].field_0x8 = 0;
      }
      pBVar1 = &this->chan[7].op[1].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      if ((*pBVar1 == '\0') && (this->chan[7].op[1].state != '\0')) {
        this->chan[7].op[1].state = '\x01';
        this->chan[7].op[1].volHandler =
             (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
        *(undefined8 *)&this->chan[7].op[1].field_0x8 = 0;
      }
      pBVar1 = &this->chan[8].op[0].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      if ((*pBVar1 == '\0') && (this->chan[8].op[0].state != '\0')) {
        this->chan[8].op[0].state = '\x01';
        this->chan[8].op[0].volHandler =
             (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
        *(undefined8 *)&this->chan[8].op[0].field_0x8 = 0;
      }
      pBVar1 = &this->chan[8].op[1].keyOn;
      *pBVar1 = *pBVar1 & 0xfd;
      bVar2 = *pBVar1;
    }
    else {
      if ((bVar2 & 0x20) != 0) {
        if (this->opl3Active == '\0') {
          pcVar3 = Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)10>;
        }
        else {
          pcVar3 = Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)11>;
        }
        this->chan[6].synthHandler = (SynthHandler)pcVar3;
        *(undefined8 *)&this->chan[6].field_0xd8 = 0;
      }
      bVar2 = this->chan[6].op[0].keyOn;
      if ((val & 0x10) == 0) {
        this->chan[6].op[0].keyOn = bVar2 & 0xfd;
        if (((bVar2 & 0xfd) == 0) && (this->chan[6].op[0].state != '\0')) {
          this->chan[6].op[0].state = '\x01';
          this->chan[6].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
          *(undefined8 *)&this->chan[6].op[0].field_0x8 = 0;
        }
        pBVar1 = &this->chan[6].op[1].keyOn;
        *pBVar1 = *pBVar1 & 0xfd;
        if ((*pBVar1 == '\0') && (this->chan[6].op[1].state != '\0')) {
          this->chan[6].op[1].state = '\x01';
          this->chan[6].op[1].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
          *(undefined8 *)&this->chan[6].op[1].field_0x8 = 0;
        }
      }
      else {
        if (bVar2 == 0) {
          this->chan[6].op[0].waveIndex = this->chan[6].op[0].waveStart;
          this->chan[6].op[0].rateIndex = 0;
          this->chan[6].op[0].state = '\x04';
          this->chan[6].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[6].op[0].field_0x8 = 0;
        }
        this->chan[6].op[0].keyOn = bVar2 | 2;
        bVar2 = this->chan[6].op[1].keyOn;
        if (bVar2 == 0) {
          this->chan[6].op[1].waveIndex = this->chan[6].op[1].waveStart;
          this->chan[6].op[1].rateIndex = 0;
          this->chan[6].op[1].state = '\x04';
          this->chan[6].op[1].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[6].op[1].field_0x8 = 0;
        }
        this->chan[6].op[1].keyOn = bVar2 | 2;
      }
      bVar2 = this->chan[7].op[0].keyOn;
      if ((val & 1) == 0) {
        this->chan[7].op[0].keyOn = bVar2 & 0xfd;
        if (((bVar2 & 0xfd) == 0) && (this->chan[7].op[0].state != '\0')) {
          this->chan[7].op[0].state = '\x01';
          this->chan[7].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
          *(undefined8 *)&this->chan[7].op[0].field_0x8 = 0;
        }
      }
      else {
        if (bVar2 == 0) {
          this->chan[7].op[0].waveIndex = this->chan[7].op[0].waveStart;
          this->chan[7].op[0].rateIndex = 0;
          this->chan[7].op[0].state = '\x04';
          this->chan[7].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[7].op[0].field_0x8 = 0;
        }
        this->chan[7].op[0].keyOn = bVar2 | 2;
      }
      bVar2 = this->chan[7].op[1].keyOn;
      if ((val & 8) == 0) {
        this->chan[7].op[1].keyOn = bVar2 & 0xfd;
        if (((bVar2 & 0xfd) == 0) && (this->chan[7].op[1].state != '\0')) {
          this->chan[7].op[1].state = '\x01';
          this->chan[7].op[1].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
          *(undefined8 *)&this->chan[7].op[1].field_0x8 = 0;
        }
      }
      else {
        if (bVar2 == 0) {
          this->chan[7].op[1].waveIndex = this->chan[7].op[1].waveStart;
          this->chan[7].op[1].rateIndex = 0;
          this->chan[7].op[1].state = '\x04';
          this->chan[7].op[1].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[7].op[1].field_0x8 = 0;
        }
        this->chan[7].op[1].keyOn = bVar2 | 2;
      }
      bVar2 = this->chan[8].op[0].keyOn;
      if ((val & 4) == 0) {
        this->chan[8].op[0].keyOn = bVar2 & 0xfd;
        if (((bVar2 & 0xfd) == 0) && (this->chan[8].op[0].state != '\0')) {
          this->chan[8].op[0].state = '\x01';
          this->chan[8].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
          *(undefined8 *)&this->chan[8].op[0].field_0x8 = 0;
        }
      }
      else {
        if (bVar2 == 0) {
          this->chan[8].op[0].waveIndex = this->chan[8].op[0].waveStart;
          this->chan[8].op[0].rateIndex = 0;
          this->chan[8].op[0].state = '\x04';
          this->chan[8].op[0].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[8].op[0].field_0x8 = 0;
        }
        this->chan[8].op[0].keyOn = bVar2 | 2;
      }
      bVar2 = this->chan[8].op[1].keyOn;
      if ((val & 2) != 0) {
        if (bVar2 == 0) {
          this->chan[8].op[1].waveIndex = this->chan[8].op[1].waveStart;
          this->chan[8].op[1].rateIndex = 0;
          this->chan[8].op[1].state = '\x04';
          this->chan[8].op[1].volHandler =
               (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)4>;
          *(undefined8 *)&this->chan[8].op[1].field_0x8 = 0;
        }
        this->chan[8].op[1].keyOn = bVar2 | 2;
        return;
      }
      bVar2 = bVar2 & 0xfd;
      this->chan[8].op[1].keyOn = bVar2;
    }
    if ((bVar2 == 0) && (this->chan[8].op[1].state != '\0')) {
      this->chan[8].op[1].state = '\x01';
      this->chan[8].op[1].volHandler =
           (VolumeHandler)Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)1>;
      *(undefined8 *)&this->chan[8].op[1].field_0x8 = 0;
    }
  }
  return;
}

Assistant:

void Chip::WriteBD( Bit8u val ) {
	Bit8u change = regBD ^ val;
	if ( !change )
		return;
	regBD = val;
	//TODO could do this with shift and xor?
	vibratoStrength = (val & 0x40) ? 0x00 : 0x01;
	tremoloStrength = (val & 0x80) ? 0x00 : 0x02;
	if ( val & 0x20 ) {
		//Drum was just enabled, make sure channel 6 has the right synth
		if ( change & 0x20 ) {
			if ( opl3Active ) {
				chan[6].synthHandler = &Channel::BlockTemplate< sm3Percussion >;
			} else {
				chan[6].synthHandler = &Channel::BlockTemplate< sm2Percussion >;
			}
		}
		//Bass Drum
		if ( val & 0x10 ) {
			chan[6].op[0].KeyOn( 0x2 );
			chan[6].op[1].KeyOn( 0x2 );
		} else {
			chan[6].op[0].KeyOff( 0x2 );
			chan[6].op[1].KeyOff( 0x2 );
		}
		//Hi-Hat
		if ( val & 0x1 ) {
			chan[7].op[0].KeyOn( 0x2 );
		} else {
			chan[7].op[0].KeyOff( 0x2 );
		}
		//Snare
		if ( val & 0x8 ) {
			chan[7].op[1].KeyOn( 0x2 );
		} else {
			chan[7].op[1].KeyOff( 0x2 );
		}
		//Tom-Tom
		if ( val & 0x4 ) {
			chan[8].op[0].KeyOn( 0x2 );
		} else {
			chan[8].op[0].KeyOff( 0x2 );
		}
		//Top Cymbal
		if ( val & 0x2 ) {
			chan[8].op[1].KeyOn( 0x2 );
		} else {
			chan[8].op[1].KeyOff( 0x2 );
		}
	//Toggle keyoffs when we turn off the percussion
	} else if ( change & 0x20 ) {
		//Trigger a reset to setup the original synth handler
		chan[6].ResetC0( this );
		chan[6].op[0].KeyOff( 0x2 );
		chan[6].op[1].KeyOff( 0x2 );
		chan[7].op[0].KeyOff( 0x2 );
		chan[7].op[1].KeyOff( 0x2 );
		chan[8].op[0].KeyOff( 0x2 );
		chan[8].op[1].KeyOff( 0x2 );
	}
}